

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPackage.cpp
# Opt level: O3

PackageSymbol * slang::ast::builtins::createStdPackage(Compilation *c)

{
  Type *retType;
  Segment *pSVar1;
  undefined6 uVar2;
  Compilation *pCVar3;
  EnumValueSymbol *this;
  TransparentMemberSymbol *symbol;
  TypeAliasType *retType_00;
  Type *pTVar4;
  long lVar5;
  GenericClassDefSymbol *this_00;
  Scope *pSVar6;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar7;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&)> specializeFunc;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  ClassBuilder builder;
  MethodBuilder self;
  MethodBuilder srandom;
  MethodBuilder set_randstate;
  char *name;
  MethodBuilder try_get;
  MethodBuilder get;
  ClassBuilder local_3c8;
  Compilation *local_3b8;
  _Storage<slang::SVInt,_false> local_3b0;
  char local_3a0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_398;
  undefined1 local_378;
  Scope *local_370;
  EnumType *local_368;
  _Storage<slang::SVInt,_false> local_360;
  char local_350;
  anon_union_8_3_62382250_for_ParameterDecl_0 local_348;
  uint local_340;
  undefined1 uStack_33c;
  byte bStack_33b;
  undefined2 uStack_33a;
  PackageSymbol *local_2f8;
  Scope *local_2f0;
  _Storage<slang::SVInt,_false> local_2e8;
  char local_2d8;
  _Storage<slang::SVInt,_false> local_298;
  char local_288;
  _Storage<slang::SVInt,_false> local_248;
  char local_238;
  _Storage<slang::SVInt,_false> local_1f8;
  char local_1e8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_1a8;
  uint local_1a0;
  ushort local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  MethodBuilder local_170;
  MethodBuilder local_120;
  MethodBuilder local_d0;
  MethodBuilder local_80;
  
  local_348._0_4_ = 1;
  local_2f8 = BumpAllocator::
              emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                        (&c->super_BumpAllocator,c,(char (*) [4])"std",
                         (SourceLocation *)&SourceLocation::NoLocation,c->wireNetType,
                         (VariableLifetime *)&local_348);
  local_370 = &local_2f8->super_Scope;
  name_08._M_str = "process";
  name_08._M_len = 7;
  ClassBuilder::ClassBuilder(&local_3c8,c,name_08);
  (local_3c8.type)->isAbstract = true;
  local_1a8.pVal = (uint64_t *)&(local_3c8.type)->super_Scope;
  local_1a0 = 1;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  local_368 = BumpAllocator::
              emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation_const&,slang::ast::Type_const&,slang::ast::ASTContext&>
                        (&c->super_BumpAllocator,c,(SourceLocation *)&SourceLocation::NoLocation,
                         c->intType,(ASTContext *)&local_1a8);
  local_368->systemId = 0x7ffff7ff;
  local_2f0 = &local_368->super_Scope;
  aVar7.valueSyntax = (ParameterDeclarationSyntax *)0x0;
  lVar5 = 0;
  local_3b8 = c;
  do {
    local_120.compilation = *(Compilation **)((long)&PTR_anon_var_dwarf_10be6c0_0050eef8 + lVar5);
    this = BumpAllocator::
           emplace<slang::ast::EnumValueSymbol,char_const*&,slang::SourceLocation_const&>
                     (&c->super_BumpAllocator,(char **)&local_120,
                      (SourceLocation *)&SourceLocation::NoLocation);
    (this->super_ValueSymbol).declaredType.type = (Type *)local_368;
    Scope::addMember(local_2f0,(Symbol *)this);
    local_340 = 0x20;
    uStack_33c = 1;
    bStack_33b = 0;
    local_348 = aVar7;
    SVInt::clearUnusedBits((SVInt *)&local_348);
    local_398._0_8_ = local_348;
    local_398._8_4_ = local_340;
    local_398._13_1_ = bStack_33b;
    local_398._12_1_ = uStack_33c;
    if (0x40 < local_340 || (bStack_33b & 1) != 0) {
      local_348.valueSyntax = (ParameterDeclarationSyntax *)0x0;
    }
    local_378 = 1;
    EnumValueSymbol::setValue(this,(ConstantValue *)&local_398);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_398);
    if (((0x40 < local_340) || ((bStack_33b & 1) != 0)) &&
       (local_348.valueSyntax != (ParameterDeclarationSyntax *)0x0)) {
      operator_delete__(local_348.valueSyntax);
    }
    c = local_3b8;
    pSVar6 = &(local_3c8.type)->super_Scope;
    symbol = BumpAllocator::
             emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol&>
                       (&local_3b8->super_BumpAllocator,this);
    Scope::addMember(pSVar6,&symbol->super_Symbol);
    lVar5 = lVar5 + 8;
    aVar7.valueSyntax =
         (ParameterDeclarationSyntax *)
         ((long)&((aVar7.valueSyntax)->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent
         + 1);
  } while (lVar5 != 0x28);
  retType_00 = BumpAllocator::
               emplace<slang::ast::TypeAliasType,char_const(&)[6],slang::SourceLocation_const&>
                         (&c->super_BumpAllocator,(char (*) [6])0x430f79,
                          (SourceLocation *)&SourceLocation::NoLocation);
  (retType_00->targetType).type = (Type *)local_368;
  Scope::addMember(&(local_3c8.type)->super_Scope,(Symbol *)retType_00);
  pTVar4 = c->voidType;
  name_09._M_str = "self";
  name_09._M_len = 4;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_348,&local_3c8,name_09,&(local_3c8.type)->super_Type,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_348,(bitmask<slang::ast::MethodFlags>)0x4);
  name_10._M_str = "status";
  name_10._M_len = 6;
  ClassBuilder::addMethod(&local_120,&local_3c8,name_10,&retType_00->super_Type,Function);
  MethodBuilder::~MethodBuilder(&local_120);
  name_11._M_str = "kill";
  name_11._M_len = 4;
  ClassBuilder::addMethod(&local_80,&local_3c8,name_11,pTVar4,Function);
  MethodBuilder::~MethodBuilder(&local_80);
  name_12._M_str = "await";
  name_12._M_len = 5;
  ClassBuilder::addMethod(&local_d0,&local_3c8,name_12,pTVar4,Task);
  MethodBuilder::~MethodBuilder(&local_d0);
  name_13._M_str = "suspend";
  name_13._M_len = 7;
  ClassBuilder::addMethod((MethodBuilder *)&local_1f8._M_value,&local_3c8,name_13,pTVar4,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_1f8._M_value);
  name_14._M_str = "resume";
  name_14._M_len = 6;
  ClassBuilder::addMethod((MethodBuilder *)&local_248._M_value,&local_3c8,name_14,pTVar4,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_248._M_value);
  name_15._M_str = "get_randstate";
  name_15._M_len = 0xd;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_298._M_value,&local_3c8,name_15,c->stringType,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_298._M_value);
  name_16._M_str = "srandom";
  name_16._M_len = 7;
  ClassBuilder::addMethod((MethodBuilder *)&local_2e8._M_value,&local_3c8,name_16,pTVar4,Function);
  pSVar6 = local_370;
  local_3a0 = '\0';
  name_00._M_str = "seed";
  name_00._M_len = 4;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_2e8._M_value,name_00,c->intType,In,
             (optional<slang::SVInt> *)&local_3b0._M_value);
  if (((local_3a0 == '\x01') &&
      ((local_3a0 = '\0', 0x40 < local_3b0._M_value.super_SVIntStorage.bitWidth ||
       ((local_3b0._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_3b0._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_3b0._M_value.super_SVIntStorage.field_0);
  }
  name_17._M_str = "set_randstate";
  name_17._M_len = 0xd;
  ClassBuilder::addMethod(&local_170,&local_3c8,name_17,pTVar4,Function);
  local_350 = '\0';
  name_01._M_str = "state";
  name_01._M_len = 5;
  MethodBuilder::addArg
            (&local_170,name_01,c->stringType,In,(optional<slang::SVInt> *)&local_360._M_value);
  if (((local_350 == '\x01') &&
      ((local_350 = '\0', 0x40 < local_360._M_value.super_SVIntStorage.bitWidth ||
       ((local_360._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_360._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_360._M_value.super_SVIntStorage.field_0);
  }
  MethodBuilder::~MethodBuilder(&local_170);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_2e8._M_value);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_348);
  Scope::addMember(pSVar6,(Symbol *)local_3c8.type);
  pCVar3 = local_3b8;
  name_18._M_str = "semaphore";
  name_18._M_len = 9;
  ClassBuilder::ClassBuilder((ClassBuilder *)&local_170,local_3b8,name_18);
  pTVar4 = pCVar3->intType;
  retType = pCVar3->voidType;
  local_1a0 = 0x20;
  local_19c = 1;
  local_1a8.val = 0;
  SVInt::clearUnusedBits((SVInt *)&local_1a8);
  local_398._8_4_ = 0x20;
  local_398._12_2_ = 1;
  local_398._0_8_ = (void *)0x1;
  SVInt::clearUnusedBits((SVInt *)&local_398);
  name_19._M_str = "new";
  name_19._M_len = 3;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_348,(ClassBuilder *)&local_170,name_19,retType,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_348,(bitmask<slang::ast::MethodFlags>)0x8);
  SVInt::SVInt(&local_1f8._M_value,(SVIntStorage *)&local_1a8);
  local_1e8 = '\x01';
  name_02._M_str = "keyCount";
  name_02._M_len = 8;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_348,name_02,pTVar4,In,
             (optional<slang::SVInt> *)&local_1f8._M_value);
  if ((local_1e8 == '\x01') &&
     (((local_1e8 = '\0', 0x40 < local_1f8._M_value.super_SVIntStorage.bitWidth ||
       ((local_1f8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_1f8._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_1f8._M_value.super_SVIntStorage.field_0);
  }
  name_20._M_str = "put";
  name_20._M_len = 3;
  ClassBuilder::addMethod(&local_120,(ClassBuilder *)&local_170,name_20,retType,Function);
  SVInt::SVInt(&local_248._M_value,(SVIntStorage *)&local_398);
  local_238 = '\x01';
  name_03._M_str = "keyCount";
  name_03._M_len = 8;
  MethodBuilder::addArg(&local_120,name_03,pTVar4,In,(optional<slang::SVInt> *)&local_248._M_value);
  if (((local_238 == '\x01') &&
      ((local_238 = '\0', 0x40 < local_248._M_value.super_SVIntStorage.bitWidth ||
       ((local_248._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_248._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_248._M_value.super_SVIntStorage.field_0);
  }
  name_21._M_str = "get";
  name_21._M_len = 3;
  ClassBuilder::addMethod(&local_80,(ClassBuilder *)&local_170,name_21,retType,Task);
  SVInt::SVInt(&local_298._M_value,(SVIntStorage *)&local_398);
  local_288 = '\x01';
  name_04._M_str = "keyCount";
  name_04._M_len = 8;
  MethodBuilder::addArg(&local_80,name_04,pTVar4,In,(optional<slang::SVInt> *)&local_298._M_value);
  if (((local_288 == '\x01') &&
      ((local_288 = '\0', 0x40 < local_298._M_value.super_SVIntStorage.bitWidth ||
       ((local_298._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_298._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_298._M_value.super_SVIntStorage.field_0);
  }
  name_22._M_str = "try_get";
  name_22._M_len = 7;
  ClassBuilder::addMethod(&local_d0,(ClassBuilder *)&local_170,name_22,pTVar4,Function);
  SVInt::SVInt(&local_2e8._M_value,(SVIntStorage *)&local_398);
  local_2d8 = '\x01';
  name_05._M_str = "keyCount";
  name_05._M_len = 8;
  MethodBuilder::addArg(&local_d0,name_05,pTVar4,In,(optional<slang::SVInt> *)&local_2e8._M_value);
  if ((local_2d8 == '\x01') &&
     (((local_2d8 = '\0', 0x40 < local_2e8._M_value.super_SVIntStorage.bitWidth ||
       ((local_2e8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_2e8._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_2e8._M_value.super_SVIntStorage.field_0);
  }
  MethodBuilder::~MethodBuilder(&local_d0);
  MethodBuilder::~MethodBuilder(&local_80);
  MethodBuilder::~MethodBuilder(&local_120);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_348);
  if (((0x40 < (uint)local_398._8_4_) || ((local_398._12_2_ & 0x100) != 0)) &&
     ((void *)local_398._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_398._0_8_);
  }
  if (((0x40 < local_1a0) || ((local_19c & 0x100) != 0)) && ((void *)local_1a8.val != (void *)0x0))
  {
    operator_delete__(local_1a8.pVal);
  }
  Scope::addMember(pSVar6,&(local_170.symbol)->super_Symbol);
  pCVar3 = local_3b8;
  pSVar1 = (local_3b8->genericClassAllocator).super_BumpAllocator.head;
  this_00 = (GenericClassDefSymbol *)((ulong)(pSVar1->current + 7) & 0xfffffffffffffff8);
  if ((GenericClassDefSymbol *)(local_3b8->genericClassAllocator).super_BumpAllocator.endPtr <
      this_00 + 1) {
    this_00 = (GenericClassDefSymbol *)
              BumpAllocator::allocateSlow
                        (&(local_3b8->genericClassAllocator).super_BumpAllocator,0x228,8);
  }
  else {
    pSVar1->current = (byte *)(this_00 + 1);
  }
  name_06._M_str = "mailbox";
  name_06._M_len = 7;
  specializeFunc.callable = (intptr_t)&local_120;
  specializeFunc.callback =
       function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&)>::
       callback_fn<slang::ast::builtins::createMailboxClass(slang::ast::Compilation&)::__0>;
  GenericClassDefSymbol::GenericClassDefSymbol
            (this_00,name_06,(SourceLocation)0xffffffffffffffff,specializeFunc);
  pTVar4 = Compilation::getType(pCVar3,Untyped);
  name_07._M_str = "T";
  name_07._M_len = 1;
  Definition::ParameterDecl::ParameterDecl
            ((ParameterDecl *)&local_348,name_07,(SourceLocation)0xffffffffffffffff,false,true,
             pTVar4);
  GenericClassDefSymbol::addParameterDecl(this_00,(ParameterDecl *)&local_348);
  pSVar6 = local_370;
  Scope::addMember(local_370,&this_00->super_Symbol);
  name_23._M_str = "randomize";
  name_23._M_len = 9;
  MethodBuilder::MethodBuilder((MethodBuilder *)&local_348,pCVar3,name_23,pCVar3->intType,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_348,(bitmask<slang::ast::MethodFlags>)0x400);
  uVar2 = CONCAT15(bStack_33b,CONCAT14(uStack_33c,local_340));
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_348);
  Scope::addMember(pSVar6,(Symbol *)CONCAT26(uStack_33a,uVar2));
  return local_2f8;
}

Assistant:

const PackageSymbol& createStdPackage(Compilation& c) {
    auto pkg = c.emplace<PackageSymbol>(c, "std", NL, c.getWireNetType(), VariableLifetime::Static);
    pkg->addMember(createProcessClass(c));
    pkg->addMember(createSemaphoreClass(c));
    pkg->addMember(createMailboxClass(c));
    pkg->addMember(createRandomizeFunc(c));

    return *pkg;
}